

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O1

string * XmlRpc::XmlRpcUtil::parseTag
                   (string *__return_storage_ptr__,char *tag,string *xml,int *offset)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  string etag;
  long *local_50;
  int local_48;
  long local_40 [2];
  
  iVar1 = *offset;
  if (iVar1 < (int)xml->_M_string_length) {
    strlen(tag);
    lVar2 = std::__cxx11::string::find((char *)xml,(ulong)tag,(long)iVar1);
    if (lVar2 != -1) {
      sVar3 = strlen(tag);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"</","");
      std::__cxx11::string::append((char *)&local_50);
      lVar2 = std::__cxx11::string::find((char *)xml,(ulong)local_50,sVar3 + lVar2);
      if (lVar2 == -1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        *offset = local_48 + (int)lVar2;
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)xml);
      }
      if (local_50 == local_40) {
        return __return_storage_ptr__;
      }
      operator_delete(local_50,local_40[0] + 1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string 
XmlRpcUtil::parseTag(const char* tag, std::string const& xml, int* offset)
{
  if (*offset >= int(xml.length())) return std::string();
  size_t istart = xml.find(tag, *offset);
  if (istart == std::string::npos) return std::string();
  istart += strlen(tag);
  std::string etag = "</";
  etag += tag + 1;
  size_t iend = xml.find(etag, istart);
  if (iend == std::string::npos) return std::string();

  *offset = int(iend + etag.length());
  return xml.substr(istart, iend-istart);
}